

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Exp::forward_impl
          (Exp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *pTVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  assign_op<float,_float> local_39;
  float *local_38;
  ulong local_30;
  float *local_18;
  ulong local_10;
  
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = pTVar1->v;
  uVar3 = (ulong)(pTVar1->d).nd;
  iVar2 = 1;
  iVar4 = 1;
  if (uVar3 != 0) {
    iVar4 = 1;
    uVar5 = 0;
    do {
      iVar4 = iVar4 * (pTVar1->d).d[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  local_30 = (ulong)(iVar4 * (pTVar1->d).bd);
  local_18 = fx->v;
  uVar3 = (ulong)(fx->d).nd;
  if (uVar3 != 0) {
    iVar2 = 1;
    uVar5 = 0;
    do {
      iVar2 = iVar2 * (fx->d).d[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  local_10 = (ulong)(iVar2 * (fx->d).bd);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>,Eigen::internal::assign_op<float,float>>
            ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_18,
             (CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)&local_38,&local_39);
  return;
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  fx.vec() = xs[0]->vec().array().exp();
#endif
}